

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVST4LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int iVar2;
  DecodeStatus DVar3;
  uint *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint64_t extraout_RDX_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint64_t Address_04;
  uint64_t extraout_RDX_01;
  uint uVar4;
  uint uVar5;
  uint RegNo;
  DecodeStatus local_3c;
  
  local_3c = MCDisassembler_Fail;
  Decoder_00 = &switchD_00150b20::switchdataD_001c9fd0;
  switch(Insn >> 10 & 3) {
  case 0:
    uVar5 = Insn >> 2 & 4;
    uVar4 = Insn >> 5 & 7;
    iVar2 = 1;
    goto LAB_00150b90;
  case 1:
    uVar5 = Insn >> 1 & 8;
    uVar4 = Insn >> 6 & 3;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    uVar5 = Insn >> 4 & 3;
    if (uVar5 != 0) {
      if (uVar5 == 3) {
        return MCDisassembler_Fail;
      }
      Decoder_00 = (uint *)(ulong)uVar5;
      uVar5 = 4 << (sbyte)uVar5;
    }
    uVar4 = Insn >> 7 & 1;
    uVar1 = Insn & 0x40;
    break;
  case 3:
    goto switchD_00150b20_caseD_3;
  }
  iVar2 = 2 - (uint)(uVar1 == 0);
LAB_00150b90:
  uVar1 = Insn >> 0x10 & 0xf;
  RegNo = Insn & 0xf;
  if (RegNo == 0xf) {
    local_3c = MCDisassembler_Success;
LAB_00150bc8:
    DVar3 = DecodeGPRRegisterClass(Inst,uVar1,Address,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) goto LAB_00150cb1;
      local_3c = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar5);
    Address_01 = Address_00;
    if (RegNo != 0xf) {
      if (RegNo == 0xd) {
        MCOperand_CreateReg0(Inst,0);
        Address_01 = extraout_RDX_00;
      }
      else {
        DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder_00);
        Address_01 = extraout_RDX_01;
        if (DVar3 != MCDisassembler_Success) {
          if (DVar3 != MCDisassembler_SoftFail) {
            return MCDisassembler_Fail;
          }
          local_3c = MCDisassembler_SoftFail;
        }
      }
    }
    uVar5 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
    DVar3 = DecodeDPRRegisterClass(Inst,uVar5,Address_01,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeDPRRegisterClass(Inst,iVar2 + uVar5,Address_02,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeDPRRegisterClass(Inst,uVar5 + iVar2 * 2,Address_03,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeDPRRegisterClass(Inst,iVar2 * 3 + uVar5,Address_04,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_3c = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
  }
  else {
    local_3c = DecodeGPRRegisterClass(Inst,uVar1,Address,Decoder_00);
    Decoder_00 = (uint *)(ulong)(local_3c | 2);
    Address = extraout_RDX;
    if ((local_3c | 2) == MCDisassembler_Success) goto LAB_00150bc8;
LAB_00150cb1:
    local_3c = MCDisassembler_Fail;
  }
switchD_00150b20_caseD_3:
  return local_3c;
}

Assistant:

static DecodeStatus DecodeVST4LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 8;
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0:
					align = 0; break;
				case 3:
					return MCDisassembler_Fail;
				default:
					align = 4 << fieldFromInstruction_4(Insn, 4, 2); break;
			}

			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+3*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}